

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98d.c
# Opt level: O0

int main(int ac,char **av)

{
  int iVar1;
  FILE *__stream;
  s98devicetype *psVar2;
  char *pcVar3;
  s98deviceinfo *info;
  int i;
  FILE *fp;
  s98header *h;
  s98context *ctx;
  s98context context;
  char **av_local;
  int ac_local;
  
  if (ac == 2) {
    context.p = (uint8_t *)(av + 1);
    __stream = fopen(av[1],"rb");
    if (__stream == (FILE *)0x0) {
      perror(*(char **)context.p);
      av_local._4_4_ = -1;
    }
    else {
      memset((s98context *)&ctx,0,0x68);
      fseek(__stream,0,2);
      context.s98_buffer = (uint8_t *)ftell(__stream);
      context.sync_count = (uint64_t)malloc((size_t)context.s98_buffer);
      rewind(__stream);
      fread((void *)context.sync_count,1,(size_t)context.s98_buffer,__stream);
      set_offset((s98context *)&ctx,0);
      fclose(__stream);
      iVar1 = read_header((s98context *)&ctx);
      if (iVar1 == 0) {
        read_devices((s98context *)&ctx);
        printf("; S98 File: %s\n",*(undefined8 *)context.p);
        printf("; Offset to tag: 0x%08x (0 if none)\n",(ulong)context.header.timer_denominator);
        printf("; Dump start: 0x%08x\n",(ulong)context.header.compression);
        printf("; Loop start: 0x%08x (0 if non-looped)\n",(ulong)context.header.offset_to_tag);
        printf("#version %d\n",(ulong)(uint)ctx);
        printf("#timer %d/%d\n",(ulong)ctx._4_4_,(ulong)(uint)context.header.version);
        read_tag((s98context *)&ctx);
        putchar(10);
        for (info._4_4_ = 0; info._4_4_ < context.header.offset_to_loop; info._4_4_ = info._4_4_ + 1
            ) {
          psVar2 = (s98devicetype *)(context._32_8_ + (long)(int)info._4_4_ * 0x10);
          pcVar3 = device_name(*psVar2);
          printf("#device %s %d $%02x\n",pcVar3,(ulong)psVar2[1],(ulong)psVar2[2]);
        }
        putchar(10);
        s98d_dump((s98context *)&ctx);
        putchar(10);
      }
      free_context((s98context *)&ctx);
      av_local._4_4_ = 0;
    }
  }
  else {
    context.p = (uint8_t *)av;
    fprintf(_stderr,"Usage: %s filename.s98\n",*av);
    av_local._4_4_ = 1;
  }
  return av_local._4_4_;
}

Assistant:

int main(int ac, char** av)
{
    struct s98context context;
    struct s98context* ctx = &context;
    struct s98header* h = &context.header;
    FILE* fp;

    if(ac != 2) {
        fprintf(stderr, "Usage: %s filename.s98\n", *av);
        return 1;
    }

    fp = fopen(*++av, "rb");
    if(fp == NULL) {
        perror(*av);
        return -1;
    }

    memset(ctx, 0, sizeof context);

    fseek(fp, 0, SEEK_END);
    ctx->s98_size = ftell(fp);
    ctx->s98_buffer = malloc(ctx->s98_size);

    rewind(fp);
    fread(ctx->s98_buffer, 1, ctx->s98_size, fp);
    set_offset(ctx, 0);
    fclose(fp);

    if(read_header(ctx) != 0)
        goto cleanup;
    read_devices(ctx);

    printf("; S98 File: %s\n", *av);
    printf("; Offset to tag: 0x%08x (0 if none)\n", h->offset_to_tag);
    printf("; Dump start: 0x%08x\n", h->offset_to_dump);
    printf("; Loop start: 0x%08x (0 if non-looped)\n", h->offset_to_loop);

    printf("#version %d\n", h->version);
    printf("#timer %d/%d\n", h->timer_numerator, h->timer_denominator);

    read_tag(ctx);

    putchar('\n');
    {
        int i;
        for(i = 0; i < h->device_count; i++) {
            struct s98deviceinfo* info;
            info = ctx->devices + i;

            printf("#device %s %d $%02x\n", device_name(info->device), info->clock, info->panpot);
        }
    }

    putchar('\n');

    s98d_dump(ctx);

    putchar('\n');


cleanup:
    free_context(&context);

    return 0;
}